

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O0

point3d * v3rotate(point3d *p,double theta,point3d *a,point3d *b)

{
  undefined1 local_d8 [8];
  matrix4 rotmat;
  point3d q;
  vector3d axis;
  point3d *b_local;
  point3d *a_local;
  double theta_local;
  point3d *p_local;
  
  v3makeVec(b,a,(vector3d *)&q.z);
  v3rotationMat((vector3d *)&q.z,theta,(matrix4 *)local_d8);
  v3sub((vector3d *)p,(vector3d *)b,(vector3d *)(rotmat.element[3] + 3));
  v3mulPointMat((point3d *)(rotmat.element[3] + 3),(matrix4 *)local_d8);
  v3add((vector3d *)(rotmat.element[3] + 3),(vector3d *)b,(vector3d *)p);
  return p;
}

Assistant:

point3d*  v3rotate(point3d* p, double theta, point3d* a, point3d* b) {
	vector3d axis;
	point3d  q;
	matrix4  rotmat;

	v3makeVec(b, a, &axis);
	v3rotationMat(&axis, theta, &rotmat);

	v3sub(p, b, &q);
	v3mulPointMat(&q, &rotmat);
	v3add(&q, b, p);

	return(p);
}